

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ground_plane.cpp
# Opt level: O2

void __thiscall polyscope::render::GroundPlane::draw(GroundPlane *this,bool isRedraw)

{
  long *plVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float *pfVar10;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *paVar11;
  undefined4 *puVar12;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar13;
  float *pfVar14;
  element_type *peVar15;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar16;
  undefined7 in_register_00000031;
  long lVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar23 [64];
  undefined4 extraout_XMM1_Db;
  undefined4 extraout_XMM1_Db_00;
  undefined4 extraout_XMM1_Db_01;
  undefined4 uVar27;
  undefined4 extraout_XMM1_Dc;
  undefined4 extraout_XMM1_Dc_00;
  undefined4 extraout_XMM1_Dc_01;
  undefined4 uVar28;
  undefined1 auVar25 [16];
  undefined8 uVar29;
  undefined1 auVar26 [16];
  undefined4 extraout_XMM1_Dd;
  undefined4 extraout_XMM1_Dd_00;
  undefined4 extraout_XMM1_Dd_01;
  undefined4 uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined8 in_XMM4_Qa;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  vec4 vVar33;
  vec3 vVar34;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_3f8;
  allocator local_3f1;
  undefined8 local_3f0;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_3e4;
  undefined8 local_3e0;
  undefined1 local_3d8 [16];
  double local_3c0;
  long local_3b8;
  undefined1 local_3b0 [32];
  mat3 mirrorMat3;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  mat4 mirrorMat;
  undefined1 local_308 [32];
  col_type cStack_2e8;
  col_type cStack_2d8;
  undefined1 local_2c8 [32];
  col_type local_2a8 [2];
  allocator local_288 [32];
  allocator local_268 [32];
  undefined8 local_248;
  undefined8 uStack_240;
  mat4 origViewMat;
  string local_1f0 [32];
  undefined4 local_1d0;
  undefined8 local_1cc;
  undefined8 uStack_1c4;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined8 local_1a4;
  undefined8 uStack_19c;
  undefined4 local_194;
  mat<4,_4,_float,_(glm::qualifier)0> local_190;
  mat<4,_4,_float,_(glm::qualifier)0> local_150;
  undefined4 local_110;
  undefined1 local_10c [16];
  undefined4 local_fc;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined1 local_e4 [16];
  undefined4 local_d4;
  mat<4,_4,_float,_(glm::qualifier)0> local_d0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  undefined1 auVar24 [56];
  
  if ((options::groundPlaneMode != 0) && (view::style != 2)) {
    if (this->groundPlanePrepared == false) {
      prepare(this);
    }
    if (view::upDir != this->groundPlaneViewCached) {
      populateGroundPlaneGeometry(this);
    }
    anon_unknown_5::getGroundPlaneAxisAndSign();
    aVar5 = origViewMat.value[0].field_0;
    local_3b8 = (long)(int)origViewMat.value[0].field_1;
    local_3e0 = 0;
    local_3f8.x = 0.0;
    local_3f0 = 0;
    local_3e4.x = 0.0;
    if (local_3b8 == 2) {
      local_3e0 = origViewMat.value[0]._0_8_ & 0xffffffff;
      local_3f0 = origViewMat.value[0]._0_8_ << 0x20;
      _local_368 = ZEXT816(0);
      fVar19 = 1.0;
      pfVar14 = (float *)&DAT_00480dd0;
      pfVar10 = (float *)&DAT_00480ddc;
    }
    else {
      if (origViewMat.value[0].field_1 ==
          (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x1) {
        _local_368 = ZEXT816(0x3f80000000000000);
        local_3f8 = origViewMat.value[0].field_0;
        local_3f0 = origViewMat.value[0]._0_8_ & 0xffffffff;
        pfVar14 = (float *)&DAT_00480dcc;
        pfVar10 = (float *)((long)&DAT_00480dd4 + 4);
      }
      else {
        iVar7 = ((int)origViewMat.value[0].field_1 + 1) % 3;
        if (iVar7 == 2) {
          paVar11 = &local_3f8;
        }
        else if (iVar7 == 1) {
          paVar11 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                    ((long)&local_3e0 + 4);
        }
        else {
          paVar11 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&local_3e0;
        }
        *paVar11 = origViewMat.value[0].field_0;
        iVar7 = ((int)origViewMat.value[0].field_1 + 2) % 3;
        if (iVar7 == 2) {
          paVar11 = &local_3e4;
        }
        else if (iVar7 == 1) {
          paVar11 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                    ((long)&local_3f0 + 4);
        }
        else {
          paVar11 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&local_3f0;
        }
        _local_368 = SUB6416(ZEXT464(0x3f800000),0);
        pfVar14 = (float *)&state::boundingBox;
        *paVar11 = origViewMat.value[0].field_0;
        pfVar10 = (float *)&DAT_00480dd4;
      }
      fVar19 = 0.0;
    }
    if (origViewMat.value[0].field_0.x != 1.0) {
      pfVar10 = pfVar14;
    }
    if (NAN(origViewMat.value[0].field_0.x)) {
      pfVar10 = pfVar14;
    }
    auVar18._0_8_ = (double)*pfVar10;
    auVar18._8_8_ = in_XMM4_Qa;
    uVar31 = origViewMat.value[0]._0_8_ & 0xffffffff;
    auVar32._0_8_ = (double)origViewMat.value[0].field_0.x;
    auVar32._8_8_ = 0;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         state::lengthScale * 0.0001 +
         (double)(float)((uint)(options::groundPlaneHeightFactor & 1) *
                         (int)(float)(state::lengthScale * (double)DAT_00480ce4) +
                        (uint)!(bool)(options::groundPlaneHeightFactor & 1) * (int)DAT_00480ce4);
    auVar18 = vfnmadd213sd_fma(auVar25,auVar32,auVar18);
    uVar29 = auVar18._8_8_;
    local_3c0 = auVar18._0_8_;
    vVar33 = Engine::getCurrentViewport(engine);
    local_248 = vVar33._8_8_;
    uStack_240 = uVar29;
    iVar7 = Engine::getSSAAFactor(engine);
    if (options::groundPlaneMode == 2 && !isRedraw) {
      local_3d8._0_4_ = (int)CONCAT71(in_register_00000031,isRedraw);
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar15 = (this->sceneAltFrameBuffer).
                super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*peVar15->_vptr_FrameBuffer[0xb])
                (peVar15,(long)(view::bufferWidth * iVar7) / 2 & 0xffffffff,
                 (long)(view::bufferHeight * iVar7) / 2 & 0xffffffff);
      peVar15 = (this->sceneAltFrameBuffer).
                super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*peVar15->_vptr_FrameBuffer[10])
                (peVar15,0,0,(long)(view::bufferWidth * iVar7) / 2 & 0xffffffff,
                 (long)(view::bufferHeight * iVar7) / 2 & 0xffffffff);
      Engine::setCurrentPixelScaling(engine,(float)iVar7 * 0.5);
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      aVar4 = DAT_0047fb48;
      peVar15 = (this->sceneAltFrameBuffer).
                super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      *(undefined8 *)&peVar15->clearColor = view::bgColor;
      ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)&peVar15->clearColor)[2] =
           aVar4;
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[4])();
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      origViewMat.value[0].field_0 = view::viewMat;
      origViewMat.value[0].field_1 = view::viewMat_4;
      origViewMat.value[0].field_2 = DAT_00483718;
      origViewMat.value[0].field_3 = _DAT_0048371c;
      origViewMat.value[1].field_0 = uRam0000000000483720._0_4_;
      origViewMat.value[1].field_1 = DAT_00483724;
      origViewMat.value[1].field_2 = DAT_00483728;
      origViewMat.value[1].field_3 = DAT_0048372c;
      origViewMat.value[2].field_0 = uRam0000000000483730._0_4_;
      origViewMat.value[2].field_1 = uRam0000000000483730._4_4_;
      origViewMat.value[2].field_2 = DAT_00483738;
      origViewMat.value[2].field_3 = _DAT_0048373c;
      origViewMat.value[3].field_0 = uRam0000000000483740._0_4_;
      origViewMat.value[3].field_1 = uRam0000000000483740._4_4_;
      origViewMat.value[3].field_2 = uRam0000000000483748._0_4_;
      origViewMat.value[3].field_3 = DAT_0048374c;
      auVar20._0_4_ = aVar5.x * (float)local_368._0_4_;
      auVar20._4_4_ = aVar5.x * (float)local_368._4_4_;
      auVar20._8_4_ = aVar5.x * fStack_360;
      auVar20._12_4_ = aVar5.x * fStack_35c;
      local_2a8[0].field_2.z = aVar5.x * fVar19;
      local_2a8[0]._0_8_ = vmovlps_avx(auVar20);
      mirrorMat.value[0].field_0.x = 1.0;
      mirrorMat.value[0].field_1.y = 0.0;
      mirrorMat.value[0].field_2.z = 0.0;
      mirrorMat.value[0].field_3.w = 0.0;
      mirrorMat.value[1].field_0.x = 1.0;
      mirrorMat.value[1].field_1.y = 0.0;
      mirrorMat.value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      mirrorMat.value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      mirrorMat.value[2].field_0.x = 1.0;
      glm::outerProduct<3,3,float,(glm::qualifier)0>
                ((type *)&local_d0,(glm *)(local_2c8 + 0x20),
                 (vec<3,_float,_(glm::qualifier)0> *)(local_2c8 + 0x20),
                 (vec<3,_float,_(glm::qualifier)0> *)peVar15);
      glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_308,2.0,
                     (mat<3,_3,_float,_(glm::qualifier)0> *)&local_d0);
      glm::operator-(&mirrorMat3,(mat<3,_3,_float,_(glm::qualifier)0> *)&mirrorMat,
                     (mat<3,_3,_float,_(glm::qualifier)0> *)local_308);
      auVar21._0_4_ = (float)local_3c0;
      auVar21._8_8_ = in_XMM6_Qb;
      auVar21._4_4_ = in_XMM6_Db;
      local_3b0._0_8_ = 0;
      local_3b0._8_4_ = 0.0;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar18 = vxorps_avx512vl(auVar21,auVar3);
      if ((int)local_3b8 == 2) {
        puVar12 = (undefined4 *)(local_3b0 + 8);
      }
      else if ((int)local_3b8 == 1) {
        puVar12 = (undefined4 *)(local_3b0 + 4);
      }
      else {
        puVar12 = (undefined4 *)local_3b0;
      }
      *puVar12 = auVar18._0_4_;
      local_10c = ZEXT816(0) << 0x20;
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      local_110 = 0x3f800000;
      local_fc = 0x3f800000;
      local_e8 = 0x3f800000;
      local_d4 = 0x3f800000;
      auVar22._0_8_ = local_3b0._0_8_ ^ 0x8000000080000000;
      auVar22._8_8_ = auVar26._8_8_;
      local_2c8._8_4_ = local_3b0._8_4_ ^ 0x80000000;
      local_2c8._0_8_ = vmovlpd_avx(auVar22);
      local_f8 = local_10c;
      local_e4 = local_10c;
      glm::translate<float,(glm::qualifier)0>
                (&local_d0,(glm *)&local_110,(mat<4,_4,_float,_(glm::qualifier)0> *)local_2c8,
                 (vec<3,_float,_(glm::qualifier)0> *)peVar15);
      local_150.value[0].field_0.x = mirrorMat3.value[0].field_0.x;
      local_150.value[0].field_1.y = mirrorMat3.value[0].field_1.y;
      local_150.value[0].field_2.z = mirrorMat3.value[0].field_2.z;
      local_150.value[0].field_3.w = 0.0;
      local_150.value[1].field_0.x = mirrorMat3.value[1].field_0.x;
      local_150.value[1].field_1.y = mirrorMat3.value[1].field_1.y;
      local_150.value[1].field_2.z = mirrorMat3.value[1].field_2.z;
      local_150.value[1].field_3.w = 0.0;
      local_150.value[2].field_0.x = mirrorMat3.value[2].field_0.x;
      local_150.value[2].field_1.y = mirrorMat3.value[2].field_1.y;
      local_150.value[2].field_2.z = mirrorMat3.value[2].field_2.z;
      local_150.value._44_12_ = ZEXT812(0);
      local_150.value[3].field_2 = 0;
      local_150.value[3].field_3.w = 1.0;
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_308,&local_d0,&local_150);
      local_1d0 = 0x3f800000;
      local_1cc = 0;
      uStack_1c4 = 0;
      local_1bc = 0x3f800000;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = 0x3f800000;
      local_1a4 = 0;
      uStack_19c = 0;
      local_194 = 0x3f800000;
      glm::translate<float,(glm::qualifier)0>
                (&local_190,(glm *)&local_1d0,(mat<4,_4,_float,_(glm::qualifier)0> *)local_3b0,
                 (vec<3,_float,_(glm::qualifier)0> *)peVar15);
      glm::operator*(&mirrorMat,(mat<4,_4,_float,_(glm::qualifier)0> *)local_308,&local_190);
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_308,
                     (mat<4,_4,_float,_(glm::qualifier)0> *)&view::viewMat,&mirrorMat);
      view::viewMat =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_308._0_4_;
      view::viewMat_4 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_308._4_4_;
      DAT_00483718 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_308._8_4_
      ;
      _DAT_0048371c =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_308._12_4_;
      uRam0000000000483720._0_4_ =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_308._16_4_;
      DAT_00483724 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
                     local_308._20_4_;
      DAT_00483728 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
                     local_308._24_4_;
      DAT_0048372c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                     local_308._28_4_;
      uRam0000000000483730._0_4_ = cStack_2e8.field_0;
      uRam0000000000483730._4_4_ = cStack_2e8.field_1;
      DAT_00483738 = cStack_2e8.field_2;
      _DAT_0048373c = cStack_2e8.field_3;
      uRam0000000000483740._0_4_ = cStack_2d8.field_0;
      uRam0000000000483740._4_4_ = cStack_2d8.field_1;
      uRam0000000000483748._0_4_ = cStack_2d8.field_2;
      DAT_0048374c = cStack_2d8.field_3;
      bVar6 = Engine::transparencyEnabled(engine);
      if (!bVar6) {
        drawStructures();
      }
      isRedraw = local_3d8[0];
      view::viewMat = origViewMat.value[0].field_0;
      view::viewMat_4 = origViewMat.value[0].field_1;
      DAT_00483718 = origViewMat.value[0].field_2;
      _DAT_0048371c = origViewMat.value[0].field_3;
      uRam0000000000483720._0_4_ = origViewMat.value[1].field_0;
      DAT_00483724 = origViewMat.value[1].field_1;
      DAT_00483728 = origViewMat.value[1].field_2;
      DAT_0048372c = origViewMat.value[1].field_3;
      uRam0000000000483730._0_4_ = origViewMat.value[2].field_0;
      uRam0000000000483730._4_4_ = origViewMat.value[2].field_1;
      DAT_00483738 = origViewMat.value[2].field_2;
      _DAT_0048373c = origViewMat.value[2].field_3;
      uRam0000000000483740._0_4_ = origViewMat.value[3].field_0;
      uRam0000000000483740._4_4_ = origViewMat.value[3].field_1;
      uRam0000000000483748._0_4_ = origViewMat.value[3].field_2;
      DAT_0048374c = origViewMat.value[3].field_3;
    }
    if ((isRedraw == false) && (options::groundPlaneMode == 3)) {
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar15 = (this->sceneAltFrameBuffer).
                super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*peVar15->_vptr_FrameBuffer[0xb])
                (peVar15,(ulong)(uint)(view::bufferWidth * iVar7),
                 (ulong)(uint)(view::bufferHeight * iVar7));
      peVar15 = (this->sceneAltFrameBuffer).
                super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*peVar15->_vptr_FrameBuffer[10])
                (peVar15,0,0,(ulong)(uint)(view::bufferWidth * iVar7),
                 (ulong)(uint)(view::bufferHeight * iVar7));
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      aVar4 = DAT_0047fb48;
      peVar15 = (this->sceneAltFrameBuffer).
                super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      uVar27 = view::bgColor._4_4_;
      (peVar15->clearColor).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)view::bgColor
      ;
      (peVar15->clearColor).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar27;
      (peVar15->clearColor).field_2 = aVar4;
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[4])();
      for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 0x10) {
        plVar1 = *(long **)((long)&(this->blurFrameBuffers)._M_elems[0].
                                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar17);
        (**(code **)(*plVar1 + 0x58))
                  (plVar1,(long)(view::bufferWidth * iVar7) / 2 & 0xffffffff,
                   (long)(view::bufferHeight * iVar7) / 2 & 0xffffffff);
        plVar1 = *(long **)((long)&(this->blurFrameBuffers)._M_elems[0].
                                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar17);
        (**(code **)(*plVar1 + 0x50))
                  (plVar1,0,0,(long)(view::bufferWidth * iVar7) / 2 & 0xffffffff,
                   (long)(view::bufferHeight * iVar7) / 2 & 0xffffffff);
        (**(code **)(**(long **)((long)&(this->blurFrameBuffers)._M_elems[0].
                                        super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + lVar17) + 0x20))();
      }
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      mirrorMat.value[0].field_0.x = 1.0;
      origViewMat.value[0].field_0 = view::viewMat;
      origViewMat.value[0].field_1 = view::viewMat_4;
      origViewMat.value[0].field_2 = DAT_00483718;
      origViewMat.value[0].field_3 = _DAT_0048371c;
      origViewMat.value[1].field_0 = uRam0000000000483720._0_4_;
      origViewMat.value[1].field_1 = DAT_00483724;
      origViewMat.value[1].field_2 = DAT_00483728;
      origViewMat.value[1].field_3 = DAT_0048372c;
      origViewMat.value[2].field_0 = uRam0000000000483730._0_4_;
      origViewMat.value[2].field_1 = uRam0000000000483730._4_4_;
      origViewMat.value[2].field_2 = DAT_00483738;
      origViewMat.value[2].field_3 = _DAT_0048373c;
      origViewMat.value[3].field_0 = uRam0000000000483740._0_4_;
      origViewMat.value[3].field_1 = uRam0000000000483740._4_4_;
      origViewMat.value[3].field_2 = uRam0000000000483748._0_4_;
      origViewMat.value[3].field_3 = DAT_0048374c;
      mirrorMat.value[0].field_1.y = 0.0;
      mirrorMat.value[0].field_2.z = 0.0;
      mirrorMat.value[0].field_3.w = 0.0;
      mirrorMat.value[1].field_0.x = 0.0;
      mirrorMat.value[1].field_1.y = 1.0;
      mirrorMat.value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      mirrorMat.value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      mirrorMat.value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      mirrorMat.value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      mirrorMat.value[2].field_2.z = 1.0;
      mirrorMat.value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      mirrorMat.value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      mirrorMat.value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      mirrorMat.value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      mirrorMat.value[3].field_3.w = 1.0;
      paVar13 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                (mirrorMat.value + local_3b8);
      iVar7 = (int)local_3b8;
      if (iVar7 == 3) {
        paVar16 = &mirrorMat.value[3].field_3;
        paVar13 = &mirrorMat.value[local_3b8].field_3;
      }
      else if (iVar7 == 2) {
        paVar16 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                  &mirrorMat.value[3].field_2;
        paVar13 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                  &mirrorMat.value[local_3b8].field_2;
      }
      else if (iVar7 == 1) {
        paVar16 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                  &mirrorMat.value[3].field_1;
        paVar13 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                  &mirrorMat.value[local_3b8].field_1;
      }
      else {
        paVar16 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                  (mirrorMat.value + 3);
      }
      paVar13->w = 0.0;
      paVar16->w = (float)local_3c0;
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_308,
                     (mat<4,_4,_float,_(glm::qualifier)0> *)&view::viewMat,&mirrorMat);
      view::viewMat =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_308._0_4_;
      view::viewMat_4 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_308._4_4_;
      DAT_00483718 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_308._8_4_
      ;
      _DAT_0048371c =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_308._12_4_;
      uRam0000000000483720._0_4_ =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_308._16_4_;
      DAT_00483724 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
                     local_308._20_4_;
      DAT_00483728 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
                     local_308._24_4_;
      DAT_0048372c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                     local_308._28_4_;
      uRam0000000000483730._0_4_ = cStack_2e8.field_0;
      uRam0000000000483730._4_4_ = cStack_2e8.field_1;
      DAT_00483738 = cStack_2e8.field_2;
      _DAT_0048373c = cStack_2e8.field_3;
      uRam0000000000483740._0_4_ = cStack_2d8.field_0;
      uRam0000000000483740._4_4_ = cStack_2d8.field_1;
      uRam0000000000483748._0_4_ = cStack_2d8.field_2;
      DAT_0048374c = cStack_2d8.field_3;
      (*engine->_vptr_Engine[10])(engine,0);
      (*engine->_vptr_Engine[0xb])(engine,7);
      drawStructures();
      (*engine->_vptr_Engine[0xb])(engine,7);
      (*((this->blurFrameBuffers)._M_elems[0].
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      (*((this->copyTexProgram).
         super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_ShaderProgram[0x1e])();
      iVar7 = options::shadowBlurIters;
      iVar8 = Engine::getSSAAFactor(engine);
      uVar9 = ~(iVar8 * iVar7 >> 0x1f) & iVar8 * iVar7;
      while( true ) {
        if (uVar9 == 0) break;
        local_3d8._0_4_ = uVar9 - 1;
        (*((this->blurFrameBuffers)._M_elems[1].
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_FrameBuffer[3])();
        peVar2 = (this->blurProgram).
                 super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string(local_1f0,"t_image",(allocator *)local_308);
        (*peVar2->_vptr_ShaderProgram[0x1a])
                  (peVar2,local_1f0,
                   (this->blurColorTextures)._M_elems[0].
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::~string(local_1f0);
        peVar2 = (this->blurProgram).
                 super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string(local_50,"u_horizontal",(allocator *)local_308);
        (*peVar2->_vptr_ShaderProgram[3])(peVar2,local_50,1);
        std::__cxx11::string::~string(local_50);
        (*((this->blurProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_ShaderProgram[0x1e])();
        (*((this->blurFrameBuffers)._M_elems[0].
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_FrameBuffer[3])();
        peVar2 = (this->blurProgram).
                 super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string(local_70,"t_image",(allocator *)local_308);
        (*peVar2->_vptr_ShaderProgram[0x1a])
                  (peVar2,local_70,
                   (this->blurColorTextures)._M_elems[1].
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::~string(local_70);
        peVar2 = (this->blurProgram).
                 super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string(local_90,"u_horizontal",(allocator *)local_308);
        (*peVar2->_vptr_ShaderProgram[3])(peVar2,local_90,0);
        std::__cxx11::string::~string(local_90);
        (*((this->blurProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_ShaderProgram[0x1e])();
        uVar9 = local_3d8._0_4_;
      }
      view::viewMat = origViewMat.value[0].field_0;
      view::viewMat_4 = origViewMat.value[0].field_1;
      DAT_00483718 = origViewMat.value[0].field_2;
      _DAT_0048371c = origViewMat.value[0].field_3;
      uRam0000000000483720._0_4_ = origViewMat.value[1].field_0;
      DAT_00483724 = origViewMat.value[1].field_1;
      DAT_00483728 = origViewMat.value[1].field_2;
      DAT_0048372c = origViewMat.value[1].field_3;
      uRam0000000000483730._0_4_ = origViewMat.value[2].field_0;
      uRam0000000000483730._4_4_ = origViewMat.value[2].field_1;
      DAT_00483738 = origViewMat.value[2].field_2;
      _DAT_0048373c = origViewMat.value[2].field_3;
      uRam0000000000483740._0_4_ = origViewMat.value[3].field_0;
      uRam0000000000483740._4_4_ = origViewMat.value[3].field_1;
      uRam0000000000483748._0_4_ = origViewMat.value[3].field_2;
      DAT_0048374c = origViewMat.value[3].field_3;
    }
    (*engine->_vptr_Engine[6])();
    (*engine->_vptr_Engine[0x24])();
    if (options::transparencyMode != 1) {
      (*engine->_vptr_Engine[0xb])(engine,7);
    }
    view::getCameraViewMatrix();
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)local_308,"u_viewMatrix",(allocator *)&mirrorMat);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_308,&origViewMat);
    std::__cxx11::string::~string((string *)local_308);
    view::getCameraPerspectiveMatrix();
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)&local_d0,"u_projMatrix",(allocator *)&local_110);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,&local_d0,&mirrorMat);
    std::__cxx11::string::~string((string *)&local_d0);
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)&local_110,"u_viewportDim",(allocator *)&local_150);
    (*peVar2->_vptr_ShaderProgram[8])(local_248,peVar2,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    auVar24 = extraout_var;
    uVar27 = extraout_XMM1_Db;
    uVar28 = extraout_XMM1_Dc;
    uVar30 = extraout_XMM1_Dd;
    if (options::groundPlaneMode - 1U < 2) {
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string((string *)&local_150,"u_center",(allocator *)&local_190);
      (*peVar2->_vptr_ShaderProgram[9])(state::center,(ulong)DAT_00480de8,peVar2,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string((string *)&local_190,"u_basisX",(allocator *)&local_1d0);
      (*peVar2->_vptr_ShaderProgram[9])(local_3e0,(ulong)(uint)local_3f8,peVar2,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string((string *)&local_1d0,"u_basisY",(allocator *)&mirrorMat3);
      (*peVar2->_vptr_ShaderProgram[9])(local_3f0,(ulong)(uint)local_3e4,peVar2,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      auVar24 = extraout_var_00;
      uVar27 = extraout_XMM1_Db_00;
      uVar28 = extraout_XMM1_Dc_00;
      uVar30 = extraout_XMM1_Dd_00;
    }
    if (options::groundPlaneMode == 3) {
      peVar2 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string
                ((string *)&mirrorMat3,"u_shadowDarkness",(allocator *)(local_2c8 + 0x20));
      (*peVar2->_vptr_ShaderProgram[5])((ulong)options::shadowDarkness,peVar2,&mirrorMat3);
      std::__cxx11::string::~string((string *)&mirrorMat3);
      auVar24 = extraout_var_01;
      uVar27 = extraout_XMM1_Db_01;
      uVar28 = extraout_XMM1_Dc_01;
      uVar30 = extraout_XMM1_Dd_01;
    }
    vVar34 = view::getCameraWorldPosition();
    auVar23._0_8_ = vVar34._0_8_;
    auVar23._8_56_ = auVar24;
    local_3d8 = auVar23._0_16_;
    if ((int)local_3b8 == 2) {
      local_3d8._4_4_ = uVar27;
      local_3d8._0_4_ = vVar34.field_2;
      local_3d8._8_4_ = uVar28;
      local_3d8._12_4_ = uVar30;
    }
    else if ((int)local_3b8 == 1) {
      local_3d8 = vmovshdup_avx(local_3d8);
    }
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string
              ((string *)(local_2c8 + 0x20),"u_cameraHeight",(allocator *)local_3b0);
    (*peVar2->_vptr_ShaderProgram[5])(local_3d8._0_8_,peVar2,local_2c8 + 0x20);
    std::__cxx11::string::~string((string *)(local_2c8 + 0x20));
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)local_3b0,"u_upSign",(allocator *)local_2c8);
    (*peVar2->_vptr_ShaderProgram[5])(uVar31,peVar2,local_3b0);
    std::__cxx11::string::~string((string *)local_3b0);
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)local_2c8,"u_basisZ",local_268);
    (*peVar2->_vptr_ShaderProgram[9])(local_368,(ulong)(uint)fVar19,peVar2,local_2c8);
    std::__cxx11::string::~string((string *)local_2c8);
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)local_268,"u_groundHeight",local_288);
    (*peVar2->_vptr_ShaderProgram[6])(local_3c0,peVar2,local_268);
    std::__cxx11::string::~string((string *)local_268);
    peVar2 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)local_288,"u_lengthScale",&local_3f1);
    (*peVar2->_vptr_ShaderProgram[6])(state::lengthScale,peVar2,local_288);
    std::__cxx11::string::~string((string *)local_288);
    (*((this->groundPlaneProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void GroundPlane::draw(bool isRedraw) {
  if (options::groundPlaneMode == GroundPlaneMode::None) {
    return;
  }

  // don't draw ground in planar mode
  if (view::style == view::NavigateStyle::Planar) return;

  if (!groundPlanePrepared) {
    prepare();
  }
  if (view::upDir != groundPlaneViewCached) {
    populateGroundPlaneGeometry();
  }

  // Get logical "up" direction to which the ground plane is oriented
  int iP;
  float sign;
  std::tie(iP, sign) = getGroundPlaneAxisAndSign();

  glm::vec3 baseUp{0., 0., 0.};
  glm::vec3 baseForward{0., 0., 0.};
  glm::vec3 baseRight{0., 0., 0.};
  baseUp[iP] = 1.;
  baseForward[(iP + 1) % 3] = sign;
  baseRight[(iP + 2) % 3] = sign;

  // Location for ground plane
  double bboxBottom = sign == 1.0 ? std::get<0>(state::boundingBox)[iP] : std::get<1>(state::boundingBox)[iP];
  double bboxHeight = std::get<1>(state::boundingBox)[iP] - std::get<0>(state::boundingBox)[iP];
  double heightEPS = state::lengthScale * 1e-4;
  double groundHeight = bboxBottom - sign * (options::groundPlaneHeightFactor.asAbsolute() + heightEPS);

  // Viewport
  glm::vec4 viewport = render::engine->getCurrentViewport();
  glm::vec2 viewportDim{viewport[2], viewport[3]};
  int factor = render::engine->getSSAAFactor();

  auto setUniforms = [&]() {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    groundPlaneProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));

    glm::mat4 projMat = view::getCameraPerspectiveMatrix();
    groundPlaneProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
    groundPlaneProgram->setUniform("u_viewportDim", viewportDim);

    if (options::groundPlaneMode == GroundPlaneMode::Tile ||
        options::groundPlaneMode == GroundPlaneMode::TileReflection) {
      groundPlaneProgram->setUniform("u_center", state::center);
      groundPlaneProgram->setUniform("u_basisX", baseForward);
      groundPlaneProgram->setUniform("u_basisY", baseRight);
    }

    if (options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {
      groundPlaneProgram->setUniform("u_shadowDarkness", options::shadowDarkness);
    }

    float camHeight = view::getCameraWorldPosition()[iP];
    groundPlaneProgram->setUniform("u_cameraHeight", camHeight);
    groundPlaneProgram->setUniform("u_upSign", sign);
    groundPlaneProgram->setUniform("u_basisZ", baseUp);
    groundPlaneProgram->setUniform("u_groundHeight", groundHeight);
    groundPlaneProgram->setUniform("u_lengthScale", state::lengthScale);
  };

  /*
  // For all effects which will use the alternate scene buffers, prepare them
  if (options::groundPlaneMode == GroundPlaneMode::TileReflection ||
      options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {


    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();
  }
  */

  // Render the scene to implement the mirror effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::TileReflection) {

    // Prepare the alternate scene buffers
    // (use a texture 1/4 the area of the view buffer, it's supposed to be blurry anyway and this saves perf)
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a reflected view matrix
    glm::mat4 origViewMat = view::viewMat;

    glm::vec3 mirrorN = baseUp * sign;
    glm::mat3 mirrorMat3 = glm::mat3(1.0) - 2.0f * glm::outerProduct(mirrorN, mirrorN);
    glm::vec3 tVec{0., 0., 0.};
    tVec[iP] = -groundHeight;
    glm::mat4 mirrorMat =
        glm::translate(glm::mat4(1.0), -tVec) * glm::mat4(mirrorMat3) * glm::translate(glm::mat4(1.0), tVec);
    view::viewMat = view::viewMat * mirrorMat;

    // Draw everything
    if (!render::engine->transparencyEnabled()) { // skip when transparency is turned on
      drawStructures();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  // Render the scene to implement the shadow effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {

    // Prepare the alternate scene buffers
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth, factor * view::bufferHeight);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth, factor * view::bufferHeight);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Make sure all framebuffers are the right shape
    for (int i = 0; i < 2; i++) {
      blurFrameBuffers[i]->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->clear();
    }

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a view matrix which projects on to the ground plane
    glm::mat4 origViewMat = view::viewMat;
    glm::mat4 projMat = glm::mat4(1.0);
    projMat[iP][iP] = 0.;
    projMat[3][iP] = groundHeight;
    view::viewMat = view::viewMat * projMat;

    // Draw everything
    render::engine->setDepthMode();
    render::engine->setBlendMode(BlendMode::Disable);
    drawStructures();

    // Copy the depth buffer to a texture (while upsampling)
    render::engine->setBlendMode(BlendMode::Disable);
    blurFrameBuffers[0]->bindForRendering();
    copyTexProgram->draw();

    // == Blur

    // Do some blur iterations (ends in same buffer it started in)
    int nBlur = options::shadowBlurIters * render::engine->getSSAAFactor();
    // int nBlur = 0;
    for (int i = 0; i < nBlur; i++) {
      // horizontal blur
      blurFrameBuffers[1]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[0].get());
      blurProgram->setUniform("u_horizontal", 1);
      blurProgram->draw();

      // vertical blur
      blurFrameBuffers[0]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[1].get());
      blurProgram->setUniform("u_horizontal", 0);
      blurProgram->draw();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  render::engine->bindSceneBuffer();

  // Render the ground plane
  render::engine->applyTransparencySettings();
  if (options::transparencyMode != TransparencyMode::Simple) {
    render::engine->setBlendMode(BlendMode::Disable);
  }
  setUniforms();
  groundPlaneProgram->draw();
}